

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong *puVar7;
  double *pdVar8;
  reference pvVar9;
  reference pvVar10;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int in_R9D;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double *in_stack_00000008;
  int i_1;
  int i;
  double tmpSum;
  double tmpScaleFactor;
  int j;
  double *cumulativeScaleFactors;
  int cumulativeScalingFactorIndex;
  double sum;
  int k_2;
  double freq3;
  double freq2;
  double freq1;
  double freq0;
  int k_1;
  double wtl;
  int l;
  int k;
  double wt0;
  int v;
  int u;
  double *wt;
  double *frequencies;
  double *rootPartials;
  int rootPartialIndex;
  int subsetIndex;
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  int returnCode;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  size_type in_stack_fffffffffffffe98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  value_type vVar34;
  int local_128;
  int local_124;
  value_type local_118;
  int local_10c;
  int local_fc;
  double local_f8;
  int local_ec;
  int local_c4;
  int local_b8;
  int local_b4;
  int local_a8;
  int local_a4;
  int local_80;
  vector<double,_std::allocator<double>_> local_78 [2];
  vector<int,_std::allocator<int>_> local_48;
  int local_30;
  int local_2c;
  int *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = 0;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x1712b2);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::allocator<int>::~allocator((allocator<int> *)0x1712d8);
  std::allocator<double>::allocator((allocator<double> *)0x1712f8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::allocator<double>::~allocator((allocator<double> *)0x17131e);
  for (local_80 = 0; local_80 < local_2c; local_80 = local_80 + 1) {
    iVar5 = *(int *)(local_10 + (long)local_80 * 4);
    lVar6 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar5 * 8);
    puVar7 = *(ulong **)
              (*(long *)(in_RDI + 0xa8) + (long)*(int *)(local_20 + (long)local_80 * 4) * 8);
    pdVar8 = *(double **)
              (*(long *)(in_RDI + 0xa0) + (long)*(int *)(local_18 + (long)local_80 * 4) * 8);
    local_a8 = 0;
    dVar1 = *pdVar8;
    for (local_b4 = 0; local_b4 < *(int *)(in_RDI + 0x14); local_b4 = local_b4 + 1) {
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)local_a8 * 8) =
           *(double *)(lVar6 + (long)local_a8 * 8) * dVar1;
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_a8 + 1) * 8) =
           *(double *)(lVar6 + (long)(local_a8 + 1) * 8) * dVar1;
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_a8 + 2) * 8) =
           *(double *)(lVar6 + (long)(local_a8 + 2) * 8) * dVar1;
      *(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_a8 + 3) * 8) =
           *(double *)(lVar6 + (long)(local_a8 + 3) * 8) * dVar1;
      local_a8 = local_a8 + 4;
    }
    for (local_b8 = 1; local_b8 < *(int *)(in_RDI + 0x34); local_b8 = local_b8 + 1) {
      local_a4 = 0;
      dVar1 = pdVar8[local_b8];
      for (local_c4 = 0; local_c4 < *(int *)(in_RDI + 0x14); local_c4 = local_c4 + 1) {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(lVar6 + (long)local_a8 * 8);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar1;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8);
        auVar12 = vfmadd213sd_fma(auVar12,auVar20,auVar27);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8) = auVar12._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(lVar6 + (long)(local_a8 + 1) * 8);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar1;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 1) * 8);
        auVar12 = vfmadd213sd_fma(auVar13,auVar21,auVar28);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 1) * 8) = auVar12._0_8_;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(lVar6 + (long)(local_a8 + 2) * 8);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar1;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 2) * 8);
        auVar12 = vfmadd213sd_fma(auVar14,auVar22,auVar29);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 2) * 8) = auVar12._0_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(lVar6 + (long)(local_a8 + 3) * 8);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar1;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 3) * 8);
        auVar12 = vfmadd213sd_fma(auVar15,auVar23,auVar30);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 3) * 8) = auVar12._0_8_;
        local_a4 = local_a4 + 4;
        local_a8 = local_a8 + 4;
      }
      local_a8 = *(int *)(in_RDI + 0x1c) * 4 + local_a8;
    }
    uVar2 = *puVar7;
    dVar1 = (double)puVar7[1];
    uVar3 = puVar7[2];
    uVar4 = puVar7[3];
    local_a4 = 0;
    for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x14); local_ec = local_ec + 1) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar2;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar1 * *(double *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 1) * 8);
      auVar12 = vfmadd213sd_fma(auVar24,auVar16,auVar31);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar3;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 2) * 8);
      auVar12 = vfmadd213sd_fma(auVar32,auVar17,auVar12);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar4;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_a4 + 3) * 8);
      auVar12 = vfmadd213sd_fma(auVar18,auVar25,auVar12);
      local_f8 = auVar12._0_8_;
      local_a4 = local_a4 + 4;
      if ((*local_28 != -1) || ((*(ulong *)(in_RDI + 0x58) & 0x100) != 0)) {
        if ((*(ulong *)(in_RDI + 0x58) & 0x100) == 0) {
          local_fc = local_28[local_80];
        }
        else {
          local_fc = iVar5 - *(int *)(in_RDI + 0x10);
        }
        lVar6 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)local_fc * 8);
        if (local_80 == 0) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_ec);
          *pvVar9 = 0;
          vVar34 = *(value_type *)(lVar6 + (long)local_ec * 8);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_78,(long)local_ec);
          *pvVar10 = vVar34;
          for (local_10c = 1; local_10c < local_2c; local_10c = local_10c + 1) {
            if ((*(ulong *)(in_RDI + 0x58) & 0x100) == 0) {
              local_118 = *(value_type *)
                           (*(long *)(*(long *)(in_RDI + 0xc0) + (long)local_28[local_10c] * 8) +
                           (long)local_ec * 8);
            }
            else {
              local_118 = *(value_type *)
                           (*(long *)(*(long *)(in_RDI + 0xc0) +
                                     (long)(*(int *)(local_10 + (long)local_10c * 4) -
                                           *(int *)(in_RDI + 0x10)) * 8) + (long)local_ec * 8);
            }
            vVar34 = local_118;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_78,(long)local_ec);
            if (*pvVar10 < vVar34) {
              in_stack_fffffffffffffe94 = local_10c;
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_ec);
              *pvVar9 = in_stack_fffffffffffffe94;
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (local_78,(long)local_ec);
              *pvVar10 = local_118;
            }
          }
        }
        in_stack_fffffffffffffe90 = local_80;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_ec);
        if (in_stack_fffffffffffffe90 != *pvVar9) {
          dVar11 = *(double *)(lVar6 + (long)local_ec * 8);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_78,(long)local_ec);
          dVar11 = exp(dVar11 - *pvVar10);
          local_f8 = dVar11 * local_f8;
        }
      }
      if (local_80 == 0) {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8) = local_f8;
      }
      else if (local_80 == local_2c + -1) {
        dVar11 = log(*(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8) + local_f8);
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8) = dVar11;
      }
      else {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8) =
             local_f8 + *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8);
      }
    }
  }
  if ((*local_28 != -1) || ((*(ulong *)(in_RDI + 0x58) & 0x100) != 0)) {
    for (local_124 = 0; local_124 < *(int *)(in_RDI + 0x14); local_124 = local_124 + 1) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](local_78,(long)local_124);
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_124 * 8) =
           *pvVar10 + *(double *)(*(long *)(in_RDI + 0x110) + (long)local_124 * 8);
    }
  }
  *in_stack_00000008 = 0.0;
  for (local_128 = 0; local_128 < *(int *)(in_RDI + 0x14); local_128 = local_128 + 1) {
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_128 * 8);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_128 * 8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *in_stack_00000008;
    auVar12 = vfmadd213sd_fma(auVar19,auVar26,auVar33);
    *in_stack_00000008 = auVar12._0_8_;
  }
  if ((*in_stack_00000008 != *in_stack_00000008) ||
     (NAN(*in_stack_00000008) || NAN(*in_stack_00000008))) {
    local_30 = -8;
  }
  iVar5 = local_30;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  return iVar5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                                const int* categoryWeightsIndices,
                                                                const int* stateFrequenciesIndices,
                                                                const int* scaleBufferIndices,
                                                                int count,
                                                                double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;

        const REALTYPE wt0 = wt[0];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            const REALTYPE wtl = wt[l];
            for (int k = 0; k < kPatternCount; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
            v += 4 * kExtraPatterns;
        }

        REALTYPE freq0, freq1, freq2, freq3;
        freq0 = frequencies[0];
        freq1 = frequencies[1];
        freq2 = frequencies[2];
        freq3 = frequencies[3];

        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum =
                freq0 * integrationTmp[u    ] +
                freq1 * integrationTmp[u + 1] +
                freq2 * integrationTmp[u + 2] +
                freq3 * integrationTmp[u + 3];

            u += 4;

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}